

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O1

ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
* __thiscall
soplex::
ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
::operator=(ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            *this,ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *rhs)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  long lVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  long lVar6;
  long lVar7;
  byte bVar8;
  
  bVar8 = 0;
  if (this != rhs) {
    reSize(this,rhs->thesize);
    if (0 < this->thesize) {
      lVar6 = 0x80;
      lVar7 = 0;
      do {
        puVar2 = (undefined4 *)((long)(rhs->data->val).m_backend.data._M_elems + lVar6);
        puVar1 = (undefined4 *)((long)(&this->data->val + -1) + lVar6);
        puVar4 = puVar2 + -0x20;
        puVar5 = puVar1;
        for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar5 = *puVar4;
          puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
          puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
        }
        puVar1[0x1c] = puVar2[-4];
        *(undefined1 *)(puVar1 + 0x1d) = *(undefined1 *)(puVar2 + -3);
        *(undefined8 *)(puVar1 + 0x1e) = *(undefined8 *)(puVar2 + -2);
        puVar1[0x20] = *puVar2;
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x84;
      } while (lVar7 < this->thesize);
    }
  }
  return this;
}

Assistant:

ClassArray& operator=(const ClassArray& rhs)
   {
      if(this != &rhs)
      {
         reSize(rhs.size());

         for(int i = 0; i < size(); i++)
            data[i] = rhs.data[i];

         assert(isConsistent());
      }

      return *this;
   }